

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::note(Parser *this,char *msg)

{
  qsizetype qVar1;
  Symbol *in_RCX;
  long in_FS_OFFSET;
  QByteArrayView formatStringSuffix;
  QByteArrayView msg_00;
  Symbol local_60;
  QByteArrayView local_30;
  char *msg_local;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  msg_local = msg;
  if ((msg != (char *)0x0) && (this->displayNotes != false)) {
    qVar1 = QByteArrayView::lengthHelperCharArray("note: %s\n",10);
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_30,&msg_local);
    if (this->index < 1) {
      local_60.lineNum = -1;
      local_60._4_8_ = 0;
      local_60.lex.d._4_8_ = 0;
      local_60.from._4_4_ = 0;
      local_60.lex.d._12_8_ = 0;
      local_60._28_8_ = 0;
      local_60.len = -1;
    }
    else {
      in_RCX = (this->symbols).d.ptr;
      Symbol::Symbol(&local_60,in_RCX + this->index + -1);
    }
    formatStringSuffix.m_data = "note: %s\n";
    formatStringSuffix.m_size = qVar1;
    msg_00.m_data = local_30.m_data;
    msg_00.m_size = (qsizetype)in_RCX;
    printMsg(this,formatStringSuffix,msg_00,&local_60);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_60.lex.d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Parser::note(const char *msg) {
    if (displayNotes && msg)
        printMsg("note: %s\n", msg, index > 0 ? symbol() : Symbol{});
}